

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.c
# Opt level: O3

size_t x86_code(void *simple_ptr,uint32_t now_pos,_Bool is_encoder,uint8_t *buffer,size_t size)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  if (size < 5) {
    return 0;
  }
  uVar2 = *simple_ptr;
  iVar6 = now_pos - 5;
  if (now_pos - *(int *)((long)simple_ptr + 4) < 6) {
    iVar6 = *(int *)((long)simple_ptr + 4);
  }
  sVar1 = 0;
  do {
    if ((byte)(buffer[sVar1] + 0x16) < 0xfe) {
      sVar1 = sVar1 + 1;
    }
    else {
      iVar4 = (int)sVar1 + now_pos;
      uVar5 = iVar4 - iVar6;
      uVar3 = 0;
      if (uVar5 < 6) {
        if (iVar4 == iVar6) {
          uVar3 = (ulong)uVar2;
        }
        else {
          iVar6 = uVar5 + (uVar5 == 0);
          uVar3 = (ulong)uVar2;
          do {
            uVar3 = (ulong)(((uint)uVar3 & 0x77) * 2);
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
      }
      uVar2 = 1;
      uVar5 = (uint)uVar3;
      iVar6 = iVar4;
      if ((byte)(buffer[sVar1 + 4] + 1) < 2) {
        uVar2 = 0x11;
        if ((x86_code::MASK_TO_ALLOWED_STATUS[(uint)(uVar3 >> 1) & 7] == true) && (uVar5 < 0x20)) {
          iVar7 = -5 - iVar4;
          if (is_encoder) {
            iVar7 = iVar4 + 5;
          }
          uVar2 = ((uint)buffer[sVar1 + 1] |
                  (uint)buffer[sVar1 + 2] << 8 |
                  (uint)buffer[sVar1 + 3] << 0x10 | (uint)buffer[sVar1 + 4] << 0x18) + iVar7;
          if (uVar5 != 0) {
            for (; (uVar5 = uVar2 >> ((char)x86_code::MASK_TO_BIT_NUMBER[uVar3 >> 1] * -8 + 0x18U &
                                     0x1f), (char)uVar5 == -1 || ((uVar5 & 0xff) == 0));
                uVar2 = ~(uVar2 ^ (uint)(-1L << (-((char)x86_code::MASK_TO_BIT_NUMBER[uVar3 >> 1] *
                                                   '\b' + ' ') & 0x3fU))) + iVar7) {
            }
          }
          buffer[sVar1 + 4] = (uint8_t)((int)(uVar2 << 7) >> 0x1f);
          buffer[sVar1 + 3] = (uint8_t)(uVar2 >> 0x10);
          buffer[sVar1 + 2] = (uint8_t)(uVar2 >> 8);
          buffer[sVar1 + 1] = (uint8_t)uVar2;
          sVar1 = sVar1 + 5;
          uVar2 = 0;
          goto LAB_00416e96;
        }
      }
      sVar1 = sVar1 + 1;
      uVar2 = uVar2 | uVar5;
    }
LAB_00416e96:
    if (size - 5 < sVar1) {
      *(uint *)simple_ptr = uVar2;
      *(int *)((long)simple_ptr + 4) = iVar6;
      return sVar1;
    }
  } while( true );
}

Assistant:

static size_t
x86_code(void *simple_ptr, uint32_t now_pos, bool is_encoder,
		uint8_t *buffer, size_t size)
{
	static const bool MASK_TO_ALLOWED_STATUS[8]
		= { true, true, true, false, true, false, false, false };

	static const uint32_t MASK_TO_BIT_NUMBER[8]
			= { 0, 1, 2, 2, 3, 3, 3, 3 };

	lzma_simple_x86 *simple = simple_ptr;
	uint32_t prev_mask = simple->prev_mask;
	uint32_t prev_pos = simple->prev_pos;

	if (size < 5)
		return 0;

	if (now_pos - prev_pos > 5)
		prev_pos = now_pos - 5;

	const size_t limit = size - 5;
	size_t buffer_pos = 0;

	while (buffer_pos <= limit) {
		uint8_t b = buffer[buffer_pos];
		if (b != 0xE8 && b != 0xE9) {
			++buffer_pos;
			continue;
		}

		const uint32_t offset = now_pos + (uint32_t)(buffer_pos)
				- prev_pos;
		prev_pos = now_pos + (uint32_t)(buffer_pos);

		if (offset > 5) {
			prev_mask = 0;
		} else {
			for (uint32_t i = 0; i < offset; ++i) {
				prev_mask &= 0x77;
				prev_mask <<= 1;
			}
		}

		b = buffer[buffer_pos + 4];

		if (Test86MSByte(b)
			&& MASK_TO_ALLOWED_STATUS[(prev_mask >> 1) & 0x7]
				&& (prev_mask >> 1) < 0x10) {

			uint32_t src = ((uint32_t)(b) << 24)
				| ((uint32_t)(buffer[buffer_pos + 3]) << 16)
				| ((uint32_t)(buffer[buffer_pos + 2]) << 8)
				| (buffer[buffer_pos + 1]);

			uint32_t dest;
			while (true) {
				if (is_encoder)
					dest = src + (now_pos + (uint32_t)(
							buffer_pos) + 5);
				else
					dest = src - (now_pos + (uint32_t)(
							buffer_pos) + 5);

				if (prev_mask == 0)
					break;

				const uint32_t i = MASK_TO_BIT_NUMBER[
						prev_mask >> 1];

				b = (uint8_t)(dest >> (24 - i * 8));

				if (!Test86MSByte(b))
					break;

				src = dest ^ ((1ull << (32 - i * 8)) - 1);
			}

			buffer[buffer_pos + 4]
					= (uint8_t)(~(((dest >> 24) & 1) - 1));
			buffer[buffer_pos + 3] = (uint8_t)(dest >> 16);
			buffer[buffer_pos + 2] = (uint8_t)(dest >> 8);
			buffer[buffer_pos + 1] = (uint8_t)(dest);
			buffer_pos += 5;
			prev_mask = 0;

		} else {
			++buffer_pos;
			prev_mask |= 1;
			if (Test86MSByte(b))
				prev_mask |= 0x10;
		}
	}

	simple->prev_mask = prev_mask;
	simple->prev_pos = prev_pos;

	return buffer_pos;
}